

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O2

void icu_63::number::impl::blueprint_helpers::parseDigitsStem
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  int32_t iVar3;
  int index;
  int maxSignificantDigits;
  int minSig;
  int index_00;
  Precision local_50;
  
  index_00 = 0;
  while ((iVar3 = numparse::impl::StringSegment::length(segment), index_00 < iVar3 &&
         (cVar2 = numparse::impl::StringSegment::charAt(segment,index_00), cVar2 == L'@'))) {
    index_00 = index_00 + 1;
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  index = index_00;
  maxSignificantDigits = index_00;
  if (index_00 < iVar3) {
    cVar2 = numparse::impl::StringSegment::charAt(segment,index_00);
    if (cVar2 == L'+') {
      index = index_00 + 1;
      maxSignificantDigits = -1;
    }
    else {
      while ((iVar3 = numparse::impl::StringSegment::length(segment), maxSignificantDigits = index,
             index < iVar3 &&
             (cVar2 = numparse::impl::StringSegment::charAt(segment,index), cVar2 == L'#'))) {
        index = index + 1;
      }
    }
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  if (index < iVar3) {
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
  }
  else {
    if (maxSignificantDigits == -1) {
      Precision::minSignificantDigits(&local_50,index_00);
    }
    else {
      Precision::minMaxSignificantDigits(index_00,maxSignificantDigits);
    }
    FVar1.fMinSig = local_50.fUnion.fracSig.fMinSig;
    FVar1.fMaxSig = local_50.fUnion.fracSig.fMaxSig;
    FVar1.fMinFrac = local_50.fUnion.fracSig.fMinFrac;
    FVar1.fMaxFrac = local_50.fUnion.fracSig.fMaxFrac;
    *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
         CONCAT44(local_50.fUnion._8_4_,local_50.fUnion._4_4_);
    *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_50._20_8_;
    (macros->precision).fType = local_50.fType;
    *(undefined4 *)&(macros->precision).field_0x4 = local_50._4_4_;
    (macros->precision).fUnion.fracSig = FVar1;
  }
  return;
}

Assistant:

void
blueprint_helpers::parseDigitsStem(const StringSegment& segment, MacroProps& macros, UErrorCode& status) {
    U_ASSERT(segment.charAt(0) == u'@');
    int offset = 0;
    int minSig = 0;
    int maxSig;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'@') {
            minSig++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxSig = -1;
            offset++;
        } else {
            maxSig = minSig;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxSig++;
                } else {
                    break;
                }
            }
        }
    } else {
        maxSig = minSig;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid significant digits stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxSig == -1) {
        macros.precision = Precision::minSignificantDigits(minSig);
    } else {
        macros.precision = Precision::minMaxSignificantDigits(minSig, maxSig);
    }
}